

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

void file_set_attr(filetype_t type,int tmp)

{
  char *pcVar1;
  int in_ESI;
  filetype_t in_EDI;
  bool bVar2;
  char *p;
  size_t in_stack_ffffffffffffffd8;
  char *local_10;
  
  for (local_10 = (cur->file).name; *local_10 != '\0'; local_10 = local_10 + 1) {
  }
  while( true ) {
    bVar2 = false;
    if (*local_10 != '.') {
      bVar2 = local_10 != (cur->file).name;
    }
    if (!bVar2) break;
    local_10 = local_10 + -1;
  }
  if (*local_10 == '.') {
    *local_10 = '\0';
  }
  pcVar1 = (cur->file).name;
  strlen((cur->file).name);
  pcVar1 = (char *)mrealloc(pcVar1,in_stack_ffffffffffffffd8);
  (cur->file).name = pcVar1;
  for (local_10 = (cur->file).name; *local_10 != '\0'; local_10 = local_10 + 1) {
  }
  *local_10 = '.';
  local_10[1] = "ciso"[in_EDI];
  local_10[2] = '\0';
  (cur->file).type = in_EDI;
  (cur->file).tmp = in_ESI;
  return;
}

Assistant:

void file_set_attr(filetype_t type, int tmp)
{
    char* p = cur->file.name;
    while (*p)
        ++p;
    while (*p != '.' && p != cur->file.name)
        --p;

    if (*p == '.')
        *p = 0;

    cur->file.name = (char*)mrealloc(cur->file.name,
                                     strlen(cur->file.name) + 3);

    p = cur->file.name;
    while (*p != 0)
        ++p;

    *p++ = '.';
    *p++ = "ciso"[type];
    *p = 0;

    cur->file.type = type;
    cur->file.tmp = tmp;
}